

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::FboUtil::addExtFormats
          (FboUtil *this,FormatDB *db,FormatExtEntries extFmts,RenderContext *ctx)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  FormatExtEntry *context;
  _Base_ptr p_Var3;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExtensions;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  tokens;
  istringstream tokenStream;
  
  context = extFmts.m_end;
  if (context == (FormatExtEntry *)0x0) {
    ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
         (ContextInfo *)0x0;
  }
  else {
    ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
         glu::ContextInfo::create((RenderContext *)context);
  }
  do {
    if (db == (FormatDB *)extFmts.m_begin) {
      de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
                (&ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>)
      ;
      return;
    }
    requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header;
    requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tokens,*(char **)&(db->m_formatFlags)._M_t._M_impl,(allocator<char> *)&end
              );
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&tokenStream,(string *)&tokens,_S_in);
    std::__cxx11::string::~string((string *)&tokens);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&tokens,(istream_type *)&tokenStream);
    end._M_stream = (istream_type *)0x0;
    end._M_value._M_dataplus._M_p = (pointer)&end._M_value.field_2;
    end._M_value._M_string_length = 0;
    end._M_value.field_2._M_local_buf[0] = '\0';
    end._M_ok = false;
    while ((tokens._M_ok != end._M_ok ||
           ((tokens._M_ok != false && (tokens._M_stream != end._M_stream))))) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&requiredExtensions,&tokens._M_value);
      std::
      istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
      ::_M_read(&tokens);
    }
    std::__cxx11::string::~string((string *)&end._M_value);
    std::__cxx11::string::~string((string *)&tokens._M_value);
    std::__cxx11::istringstream::~istringstream((istringstream *)&tokenStream);
    p_Var2 = requiredExtensions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr
        != (ContextInfo *)0x0) {
      for (; (_Rb_tree_header *)p_Var2 != &requiredExtensions._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        bVar1 = checkExtensionSupport
                          (ctxInfo.
                           super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>
                           .m_data.ptr,(RenderContext *)context,(string *)(p_Var2 + 1));
        if (!bVar1) goto LAB_0080c1db;
      }
    }
    for (p_Var3 = (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var3 != (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var3 = (_Base_ptr)&p_Var3->field_0x4) {
      FormatDB::addExtensionFormat
                ((FormatDB *)this,
                 (ImageFormat)
                 (CONCAT44(p_Var3->_M_color >> 0x10,p_Var3->_M_color) & 0xffffffff0000ffff),
                 (db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color,
                 &requiredExtensions);
    }
LAB_0080c1db:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&requiredExtensions);
    db = (FormatDB *)&(db->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  } while( true );
}

Assistant:

void addExtFormats (FormatDB& db, FormatExtEntries extFmts, const RenderContext* ctx)
{
	const UniquePtr<ContextInfo> ctxInfo(ctx != DE_NULL ? ContextInfo::create(*ctx) : DE_NULL);
	for (const FormatExtEntry* entryIt = extFmts.begin(); entryIt != extFmts.end(); entryIt++)
	{
		bool					supported			= true;
		std::set<std::string>	requiredExtensions;

		// parse required extensions
		{
			istringstream tokenStream(string(entryIt->extensions));
			istream_iterator<string> tokens((tokenStream)), end;

			while (tokens != end)
			{
				requiredExtensions.insert(*tokens);
				++tokens;
			}
		}

		// check support
		if (ctxInfo)
		{
			for (std::set<std::string>::const_iterator extIt = requiredExtensions.begin(); extIt != requiredExtensions.end(); ++extIt)
			{
				if (!checkExtensionSupport(*ctxInfo, *ctx, *extIt))
				{
					supported = false;
					break;
				}
			}
		}

		if (supported)
			for (const FormatKey* i2 = entryIt->formats.begin(); i2 != entryIt->formats.end(); i2++)
				db.addExtensionFormat(formatKeyInfo(*i2), FormatFlags(entryIt->flags), requiredExtensions);
	}
}